

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::log_portmap
          (session_impl *this,portmap_transport transport,char *msg,listen_socket_handle *ls)

{
  bool bVar1;
  address local_50;
  listen_socket_t *local_30;
  listen_socket_t *listen_socket;
  listen_socket_handle *ls_local;
  char *msg_local;
  session_impl *psStack_10;
  portmap_transport transport_local;
  session_impl *this_local;
  
  listen_socket = (listen_socket_t *)ls;
  ls_local = (listen_socket_handle *)msg;
  msg_local._7_1_ = transport;
  psStack_10 = this;
  local_30 = listen_socket_handle::get(ls);
  bVar1 = alert_manager::should_post<libtorrent::portmap_log_alert>(&this->m_alerts);
  if (bVar1) {
    if (local_30 == (listen_socket_t *)0x0) {
      boost::asio::ip::address::address(&local_50);
    }
    else {
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                (&local_50,&local_30->local_endpoint);
    }
    alert_manager::
    emplace_alert<libtorrent::portmap_log_alert,libtorrent::portmap_transport&,char_const*&,boost::asio::ip::address>
              (&this->m_alerts,(portmap_transport *)((long)&msg_local + 7),(char **)&ls_local,
               &local_50);
  }
  return;
}

Assistant:

void session_impl::log_portmap(portmap_transport transport, char const* msg
		, listen_socket_handle const& ls) const
	{
		listen_socket_t const* listen_socket = ls.get();
		if (m_alerts.should_post<portmap_log_alert>())
			m_alerts.emplace_alert<portmap_log_alert>(transport, msg
				, listen_socket ? listen_socket->local_endpoint.address() : address());
	}